

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O3

bool __thiscall
BTree<StringBTree,_StringKey>::searchByIndex
          (BTree<StringBTree,_StringKey> *this,uint index,StringKey *key)

{
  byte bVar1;
  uint8_t *puVar2;
  byte *pbVar3;
  ushort uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  StringBTree *self;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  
  uVar11 = *(ushort *)(this->m_data + 4);
  puVar2 = this->m_data + 6;
  if (uVar11 != 0) {
    uVar4 = uVar11 << 8 | uVar11 >> 8;
    uVar11 = 1;
    if (1 < uVar4) {
      uVar11 = uVar4;
    }
    uVar9 = (uint)uVar11;
    do {
      uVar11 = swap_bytes(*(undefined2 *)puVar2);
      uVar12 = uVar11 >> 4 & 0x7ff;
      uVar5 = index - uVar12;
      if (index < uVar12) break;
      uVar4 = swap_bytes(*(undefined2 *)(puVar2 + (uVar12 * 0xc + 0xc >> 3)));
      puVar2 = puVar2 + (uVar4 >> (((byte)(uVar11 >> 4) & 1) << 2) & 0xfff);
      uVar9 = uVar9 - 1;
      index = uVar5;
    } while (uVar9 != 0);
  }
  uVar11 = swap_bytes(*(undefined2 *)(puVar2 + (index * 0xc + 0xc >> 3)));
  pbVar3 = puVar2 + (ulong)(uVar11 >> ((byte)(index << 2) & 4) & 0xfff) + 1;
  uVar10 = (ulong)pbVar3[-1];
  if ((char)pbVar3[-1] < '\0') {
    uVar8 = 0x80;
    do {
      bVar1 = *pbVar3;
      lVar6 = uVar10 - uVar8;
      pbVar3 = pbVar3 + 1;
      uVar8 = uVar8 << 7;
      uVar7 = lVar6 * 0x100;
      uVar10 = bVar1 | uVar7;
    } while ((uVar7 & uVar8) != 0);
  }
  key->m_length = (uint)uVar10;
  key->m_value = (char *)pbVar3;
  return true;
}

Assistant:

bool searchByIndex(unsigned int index, Key& key) const
	{
		const auto& self = static_cast<const Derived&>(*this);

		auto p = m_data;
		
		const auto offsetAndCount = readNextWithByteSwap<uint32_t>(p);
		const auto nodeCount = readNextWithByteSwap<uint16_t>(p);
		
		UNUSED(offsetAndCount);
		
		for (auto i = 0u; i < nodeCount; ++i) {
			const auto high = getBitsAt(p, 0) & UINT32_C(0x7FF);
			const auto nextOffset = getBitsAt(p, high + 1);

			if (index < high)
				break;
			index -= high;

			p = advancePointer(p, nextOffset);
		}
		
		const auto offset = getBitsAt(p, index + 1);
		p = advancePointer(p, offset);
		
		return self.parseData(key, p) != nullptr;
	}